

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O3

void readExtra(File *f,int exLen,int *uid,int *gid,int64_t *compSize,int64_t *uncompSize)

{
  ushort uVar1;
  short sStack_10074;
  ushort uStack_10072;
  undefined2 uStack_10070;
  undefined1 auStack_1006e [2];
  Extra extra;
  string link;
  
  if (0 < exLen) {
    link.field_2._8_8_ = compSize;
    do {
      fread(&sStack_10074,1,4,(FILE *)f->fp_);
      fread(&uStack_10070,1,(ulong)uStack_10072,(FILE *)f->fp_);
      uVar1 = uStack_10072;
      if (sStack_10074 == 1) {
        if (link.field_2._8_8_ != 0) {
          *(ulong *)link.field_2._8_8_ =
               CONCAT53(extra.field_2.zip64.uncompSize._3_5_,extra.field_2.unix.Atime._0_3_);
        }
        if (uncompSize != (int64_t *)0x0) {
          *uncompSize = CONCAT17(extra.size._1_1_,
                                 CONCAT16((undefined1)extra.size,
                                          CONCAT42(_auStack_1006e,uStack_10070)));
        }
      }
      else if (sStack_10074 == 0xd) {
        unique0x10000138 = &link._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&extra.field_2 + 0xfff8),
                   (undefined1 *)((long)&extra.field_2 + 4),
                   (long)&uStack_10070 + (ulong)uStack_10072);
        if (stack0xffffffffffffff90 != &link._M_string_length) {
          operator_delete(stack0xffffffffffffff90,link._M_string_length + 1);
        }
      }
      else if (sStack_10074 == 0x7875) {
        *uid = _auStack_1006e;
        *gid = extra._3_4_;
      }
      exLen = (exLen - (uint)uVar1) + -4;
    } while (0 < exLen);
  }
  return;
}

Assistant:

static void readExtra(File& f, int exLen, int* uid, int* gid,
                      int64_t* compSize = nullptr,
                      int64_t* uncompSize = nullptr)
{
    Extra extra;
    while (exLen > 0) {
        f.Read((uint8_t*)&extra, 4);
        f.Read(extra.data, extra.size);
        exLen -= (extra.size + 4);
        // printf("EXTRA %x\n", extra.id);
        if (extra.id == 0x7875) {

            *uid = extra.unix2.UID;
            *gid = extra.unix2.GID;
        } else if (extra.id == 0x01) {
            if (compSize)
                *compSize = extra.zip64.compSize;
            if (uncompSize)
                *uncompSize = extra.zip64.uncompSize;
        } else if (extra.id == 0xd) {
            std::string link((char*)extra.unix.var, extra.size - 12);
            // printf("LINK:%s\n", link.c_str());
        }
    }
}